

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASEParser.cpp
# Opt level: O1

void __thiscall Assimp::ASE::Parser::ParseLV4MeshFace(Parser *this,Face *out)

{
  uint32_t *puVar1;
  int iVar2;
  byte *pbVar3;
  byte bVar4;
  ulong uVar5;
  char cVar6;
  uint uVar7;
  char *pcVar8;
  long lVar9;
  uint32_t uVar10;
  byte *pbVar11;
  bool bVar12;
  
  for (pbVar3 = (byte *)this->filePtr; (*pbVar3 == 0x20 || (*pbVar3 == 9)); pbVar3 = pbVar3 + 1) {
  }
  this->filePtr = (char *)pbVar3;
  bVar4 = *pbVar3;
  if ((bVar4 < 0xe) && ((0x3401U >> (bVar4 & 0x1f) & 1) != 0)) {
    pcVar8 = "Unable to parse *MESH_FACE Element: Unexpected EOL [#1]";
LAB_003fca30:
    LogWarning(this,pcVar8);
    SkipToNextToken(this);
    return;
  }
  uVar7 = 0;
  if (0xf5 < (byte)(bVar4 - 0x3a)) {
    uVar7 = 0;
    do {
      uVar7 = (uint)(byte)(bVar4 - 0x30) + uVar7 * 10;
      bVar4 = pbVar3[1];
      pbVar3 = pbVar3 + 1;
    } while (0xf5 < (byte)(bVar4 - 0x3a));
  }
  this->filePtr = (char *)pbVar3;
  out->iFace = uVar7;
  for (pbVar3 = (byte *)this->filePtr; (*pbVar3 == 0x20 || (*pbVar3 == 9)); pbVar3 = pbVar3 + 1) {
  }
  this->filePtr = (char *)pbVar3;
  uVar5 = (ulong)*pbVar3;
  if (uVar5 < 0x3b) {
    if ((0x3401UL >> (uVar5 & 0x3f) & 1) != 0) {
      pcVar8 = "Unable to parse *MESH_FACE Element: Unexpected EOL. \':\' expected [#2]";
      goto LAB_003fca30;
    }
    if (uVar5 == 0x3a) {
      this->filePtr = (char *)(pbVar3 + 1);
    }
  }
  bVar12 = false;
  pcVar8 = "Unable to parse *MESH_FACE Element: Unexpected EOL. A,B or C expected [#3]";
  uVar7 = 0;
  do {
    for (pbVar3 = (byte *)this->filePtr; (*pbVar3 == 0x20 || (*pbVar3 == 9)); pbVar3 = pbVar3 + 1) {
    }
    this->filePtr = (char *)pbVar3;
    bVar4 = *pbVar3;
    uVar5 = (ulong)(bVar4 - 0x41);
    if (0x22 < bVar4 - 0x41) {
LAB_003fcc07:
      if ((bVar4 < 0xe) && ((0x3401U >> (bVar4 & 0x1f) & 1) != 0)) {
        pcVar8 = "Unable to parse *MESH_FACE Element: Unexpected EOL";
      }
LAB_003fcc1f:
      LogWarning(this,pcVar8);
      SkipToNextToken(this);
      if (!bVar12) {
        return;
      }
      break;
    }
    if ((0x100000001U >> (uVar5 & 0x3f) & 1) == 0) {
      if ((0x200000002U >> (uVar5 & 0x3f) & 1) == 0) {
        if ((0x400000004U >> (uVar5 & 0x3f) & 1) == 0) goto LAB_003fcc07;
        lVar9 = 2;
      }
      else {
        lVar9 = 1;
      }
    }
    else {
      lVar9 = 0;
    }
    pbVar3 = pbVar3 + 1;
    this->filePtr = (char *)pbVar3;
    for (; (*pbVar3 == 0x20 || (*pbVar3 == 9)); pbVar3 = pbVar3 + 1) {
    }
    this->filePtr = (char *)pbVar3;
    if (*pbVar3 != 0x3a) {
      pcVar8 = "Unable to parse *MESH_FACE Element: Unexpected EOL. \':\' expected [#2]";
      goto LAB_003fcc1f;
    }
    pbVar3 = pbVar3 + 1;
    this->filePtr = (char *)pbVar3;
    for (; (*pbVar3 == 0x20 || (*pbVar3 == 9)); pbVar3 = pbVar3 + 1) {
    }
    this->filePtr = (char *)pbVar3;
    bVar4 = *pbVar3;
    if ((bVar4 < 0xe) && ((0x3401U >> (bVar4 & 0x1f) & 1) != 0)) {
      pcVar8 = "Unable to parse *MESH_FACE Element: Unexpected EOL. Vertex index ecpected [#4]";
      goto LAB_003fcc1f;
    }
    uVar10 = 0;
    if (0xf5 < (byte)(bVar4 - 0x3a)) {
      uVar10 = 0;
      do {
        uVar10 = (uint)(byte)(bVar4 - 0x30) + uVar10 * 10;
        bVar4 = pbVar3[1];
        pbVar3 = pbVar3 + 1;
      } while (0xf5 < (byte)(bVar4 - 0x3a));
    }
    this->filePtr = (char *)pbVar3;
    (out->super_FaceWithSmoothingGroup).mIndices[lVar9] = uVar10;
    bVar12 = 1 < uVar7;
    uVar7 = uVar7 + 1;
  } while (uVar7 != 3);
  pbVar3 = (byte *)this->filePtr;
  do {
    uVar5 = (ulong)*pbVar3;
    if (uVar5 < 0x2b) {
      if ((0x3401UL >> (uVar5 & 0x3f) & 1) != 0) {
        return;
      }
      if (uVar5 == 0x2a) break;
    }
    pbVar3 = pbVar3 + 1;
    this->filePtr = (char *)pbVar3;
  } while( true );
  iVar2 = strncmp("*MESH_SMOOTHING",(char *)pbVar3,0xf);
  if (iVar2 == 0) {
    bVar4 = pbVar3[0xf];
    if (((ulong)bVar4 < 0x21) && ((0x100003601U >> ((ulong)bVar4 & 0x3f) & 1) != 0)) {
      pbVar11 = pbVar3 + 0x10;
      if (bVar4 == 0) {
        pbVar11 = pbVar3 + 0xf;
      }
      this->filePtr = (char *)pbVar11;
      for (; (*pbVar11 == 0x20 || (*pbVar11 == 9)); pbVar11 = pbVar11 + 1) {
      }
      this->filePtr = (char *)pbVar11;
      if ((*pbVar11 < 0xe) && ((0x3401U >> (*pbVar11 & 0x1f) & 1) != 0)) {
        pcVar8 = 
        "Unable to parse *MESH_SMOOTHING Element: Unexpected EOL. Smoothing group(s) expected [#5]";
        goto LAB_003fca30;
      }
      while( true ) {
        pcVar8 = this->filePtr;
        cVar6 = *pcVar8;
        if ((byte)(cVar6 - 0x30U) < 9) {
          bVar4 = 0;
          if (0xf5 < (byte)(cVar6 - 0x3aU)) {
            bVar4 = 0;
            do {
              bVar4 = cVar6 + -0x30 + bVar4 * '\n';
              cVar6 = pcVar8[1];
              pcVar8 = pcVar8 + 1;
            } while (0xf5 < (byte)(cVar6 - 0x3aU));
          }
          this->filePtr = pcVar8;
          puVar1 = &(out->super_FaceWithSmoothingGroup).iSmoothGroup;
          *puVar1 = *puVar1 | 1 << (bVar4 & 0x1f);
        }
        for (pcVar8 = this->filePtr; (*pcVar8 == ' ' || (*pcVar8 == '\t')); pcVar8 = pcVar8 + 1) {
        }
        this->filePtr = pcVar8;
        if (*pcVar8 != ',') break;
        pcVar8 = pcVar8 + 1;
        this->filePtr = pcVar8;
        for (; (*pcVar8 == ' ' || (*pcVar8 == '\t')); pcVar8 = pcVar8 + 1) {
        }
        this->filePtr = pcVar8;
      }
    }
  }
  pbVar3 = (byte *)this->filePtr;
  do {
    uVar5 = (ulong)*pbVar3;
    if (uVar5 < 0x2b) {
      if ((0x3401UL >> (uVar5 & 0x3f) & 1) != 0) {
        return;
      }
      if (uVar5 == 0x2a) break;
    }
    pbVar3 = pbVar3 + 1;
    this->filePtr = (char *)pbVar3;
  } while( true );
  iVar2 = strncmp("*MESH_MTLID",(char *)pbVar3,0xb);
  if (iVar2 == 0) {
    bVar4 = pbVar3[0xb];
    if (((ulong)bVar4 < 0x21) && ((0x100003601U >> ((ulong)bVar4 & 0x3f) & 1) != 0)) {
      pbVar11 = pbVar3 + 0xc;
      if (bVar4 == 0) {
        pbVar11 = pbVar3 + 0xb;
      }
      this->filePtr = (char *)pbVar11;
      for (; (*pbVar11 == 0x20 || (*pbVar11 == 9)); pbVar11 = pbVar11 + 1) {
      }
      this->filePtr = (char *)pbVar11;
      bVar4 = *pbVar11;
      if ((bVar4 < 0xe) && ((0x3401U >> (bVar4 & 0x1f) & 1) != 0)) {
        pcVar8 = "Unable to parse *MESH_MTLID Element: Unexpected EOL. Material index expected [#6]"
        ;
        goto LAB_003fca30;
      }
      uVar7 = 0;
      if (0xf5 < (byte)(bVar4 - 0x3a)) {
        uVar7 = 0;
        do {
          uVar7 = (uint)(byte)(bVar4 - 0x30) + uVar7 * 10;
          bVar4 = pbVar11[1];
          pbVar11 = pbVar11 + 1;
        } while (0xf5 < (byte)(bVar4 - 0x3a));
      }
      this->filePtr = (char *)pbVar11;
      out->iMaterial = uVar7;
    }
  }
  return;
}

Assistant:

void Parser::ParseLV4MeshFace(ASE::Face& out)
{
    // skip spaces and tabs
    if(!SkipSpaces(&filePtr))
    {
        LogWarning("Unable to parse *MESH_FACE Element: Unexpected EOL [#1]");
        SkipToNextToken();
        return;
    }

    // parse the face index
    out.iFace = strtoul10(filePtr,&filePtr);

    // next character should be ':'
    if(!SkipSpaces(&filePtr))
    {
        // FIX: there are some ASE files which haven't got : here ....
        LogWarning("Unable to parse *MESH_FACE Element: Unexpected EOL. \':\' expected [#2]");
        SkipToNextToken();
        return;
    }
    // FIX: There are some ASE files which haven't got ':' here
    if(':' == *filePtr)++filePtr;

    // Parse all mesh indices
    for (unsigned int i = 0; i < 3;++i)
    {
        unsigned int iIndex = 0;
        if(!SkipSpaces(&filePtr))
        {
            LogWarning("Unable to parse *MESH_FACE Element: Unexpected EOL");
            SkipToNextToken();
            return;
        }
        switch (*filePtr)
        {
        case 'A':
        case 'a':
            break;
        case 'B':
        case 'b':
            iIndex = 1;
            break;
        case 'C':
        case 'c':
            iIndex = 2;
            break;
        default:
            LogWarning("Unable to parse *MESH_FACE Element: Unexpected EOL. "
                "A,B or C expected [#3]");
            SkipToNextToken();
            return;
        };
        ++filePtr;

        // next character should be ':'
        if(!SkipSpaces(&filePtr) || ':' != *filePtr)
        {
            LogWarning("Unable to parse *MESH_FACE Element: "
                "Unexpected EOL. \':\' expected [#2]");
            SkipToNextToken();
            return;
        }

        ++filePtr;
        if(!SkipSpaces(&filePtr))
        {
            LogWarning("Unable to parse *MESH_FACE Element: Unexpected EOL. "
                "Vertex index ecpected [#4]");
            SkipToNextToken();
            return;
        }
        out.mIndices[iIndex] = strtoul10(filePtr,&filePtr);
    }

    // now we need to skip the AB, BC, CA blocks.
    while (true)
    {
        if ('*' == *filePtr)break;
        if (IsLineEnd(*filePtr))
        {
            //iLineNumber++;
            return;
        }
        filePtr++;
    }

    // parse the smoothing group of the face
    if (TokenMatch(filePtr,"*MESH_SMOOTHING",15))
    {
        if(!SkipSpaces(&filePtr))
        {
            LogWarning("Unable to parse *MESH_SMOOTHING Element: "
                "Unexpected EOL. Smoothing group(s) expected [#5]");
            SkipToNextToken();
            return;
        }

        // Parse smoothing groups until we don't anymore see commas
        // FIX: There needn't always be a value, sad but true
        while (true)
        {
            if (*filePtr < '9' && *filePtr >= '0')
            {
                out.iSmoothGroup |= (1 << strtoul10(filePtr,&filePtr));
            }
            SkipSpaces(&filePtr);
            if (',' != *filePtr)
            {
                break;
            }
            ++filePtr;
            SkipSpaces(&filePtr);
        }
    }

    // *MESH_MTLID  is optional, too
    while (true)
    {
        if ('*' == *filePtr)break;
        if (IsLineEnd(*filePtr))
        {
            return;
        }
        filePtr++;
    }

    if (TokenMatch(filePtr,"*MESH_MTLID",11))
    {
        if(!SkipSpaces(&filePtr))
        {
            LogWarning("Unable to parse *MESH_MTLID Element: Unexpected EOL. "
                "Material index expected [#6]");
            SkipToNextToken();
            return;
        }
        out.iMaterial = strtoul10(filePtr,&filePtr);
    }
    return;
}